

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

void produceSpriteData(Image *img,bool size8x16,
                      vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  pointer *ppuVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  iterator __position;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong x;
  long lVar8;
  ulong y;
  bool bVar9;
  uchar c;
  array<unsigned_char,_16UL> data;
  uchar local_5d;
  undefined4 local_5c;
  size_t local_58;
  ulong local_50;
  Image *local_48;
  array<unsigned_char,_16UL> local_40;
  
  uVar2 = img->_width;
  uVar3 = img->_height;
  uVar5 = uVar2 + 7;
  if (-1 < (int)uVar2) {
    uVar5 = uVar2;
  }
  uVar6 = uVar3 + 7;
  if (-1 < (int)uVar3) {
    uVar6 = uVar3;
  }
  local_5c = (undefined4)CONCAT71(in_register_00000031,size8x16);
  puVar4 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  if (uVar3 - 8 < 0xfffffff1 && uVar2 - 8 < 0xfffffff1) {
    uVar7 = (ulong)((int)uVar5 >> 3);
    local_50 = (ulong)((int)uVar6 >> 3);
    local_58 = uVar7 - 1;
    x = 0;
    y = 0;
    local_48 = img;
    do {
      imgtogb::convert(x,y,local_48,&local_40);
      lVar8 = 0;
      do {
        local_5d = local_40._M_elems[lVar8];
        __position._M_current =
             (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,__position,&local_5d
                    );
        }
        else {
          *__position._M_current = local_5d;
          ppuVar1 = &(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      if ((char)local_5c == '\0') {
        x = x + 1;
        bVar9 = x == uVar7;
        if (bVar9) {
          x = 0;
        }
        y = y + bVar9;
      }
      else {
        if ((y & 1) != 0) {
          if (x == local_58) {
            x = 0;
          }
          else {
            y = y - 2;
            x = x + 1;
          }
        }
        y = y + 1;
      }
    } while ((x < uVar7) && (y < local_50));
  }
  return;
}

Assistant:

void produceSpriteData(
	const Image &img,
	bool size8x16,
	std::vector<unsigned char> &out
) {
	std::array<unsigned char, 16> data;
	size_t ix, iy;

	size_t tiles_x = img.width() / 8;
	size_t tiles_y = img.height() / 8;

	out.clear();

	ix = iy = 0;
	while(ix < tiles_x && iy < tiles_y) {
		convert(ix, iy, img, data);
		for(unsigned char c : data) {
			out.push_back(c);
		}

		if(size8x16) {
			if(iy % 2 == 1) {
				if(ix == tiles_x-1) {
					ix = 0;
				} else {
					iy -= 2;
					ix++;
				}
			}
			iy++;
		} else {
			ix++;
			if(ix == tiles_x) {
				ix = 0;
				iy++;
			}
		}
	}
}